

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy_s.c
# Opt level: O1

errno_t memcpy_s(void *dst,size_t sizeInBytes,void *src,size_t count)

{
  int *piVar1;
  
  if (count == 0) {
    return 0;
  }
  if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 && dst == (void *)0x0) {
    (*sMBUSafeCRTAssertFunc)
              ("_CRT_WIDE(\"dst != NULL\")","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
               ,0x42);
  }
  if (dst == (void *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
      (*sMBUSafeCRTAssertFunc)
                ("_CRT_WIDE(\"dst != NULL\")","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                 ,0x42);
    }
  }
  else {
    if (src != (void *)0x0 && count <= sizeInBytes) {
      memcpy(dst,src,count);
      return 0;
    }
    memset(dst,0,sizeInBytes);
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 && src == (void *)0x0) {
      (*sMBUSafeCRTAssertFunc)
                ("_CRT_WIDE(\"src != NULL\")","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                 ,0x48);
    }
    if (src != (void *)0x0) {
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 && sizeInBytes < count) {
        (*sMBUSafeCRTAssertFunc)
                  ("_CRT_WIDE(\"sizeInBytes >= count\")","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                   ,0x49);
      }
      if (count <= sizeInBytes) {
        return 0x16;
      }
      piVar1 = __errno_location();
      *piVar1 = 0x22;
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        return 0x22;
      }
      (*sMBUSafeCRTAssertFunc)
                ("_CRT_WIDE(\"sizeInBytes >= count\")","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                 ,0x49);
      return 0x22;
    }
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
      (*sMBUSafeCRTAssertFunc)
                ("_CRT_WIDE(\"src != NULL\")","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                 ,0x48);
    }
  }
  return 0x16;
}

Assistant:

errno_t __cdecl memcpy_s(
    void * dst,
    size_t sizeInBytes,
    const void * src,
    size_t count
)
{
    if (count == 0)
    {
        /* nothing to do */
        return 0;
    }

    /* validation section */
    _VALIDATE_RETURN_ERRCODE(dst != NULL, EINVAL);
    if (src == NULL || sizeInBytes < count)
    {
        /* zeroes the destination buffer */
        memset(dst, 0, sizeInBytes);

        _VALIDATE_RETURN_ERRCODE(src != NULL, EINVAL);
        _VALIDATE_RETURN_ERRCODE(sizeInBytes >= count, ERANGE);
        /* useless, but prefast is confused */
        return EINVAL;
    }

    memcpy(dst, src, count);
    return 0;
}